

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall sglr::ReferenceContext::clear(ReferenceContext *this,deUint32 buffers)

{
  ChannelOrder CVar1;
  bool bVar2;
  byte bVar3;
  int y;
  uint uVar4;
  ConstPixelBufferAccess *pCVar5;
  byte bVar6;
  uint uVar7;
  ConstPixelBufferAccess *pCVar8;
  int x0;
  long lVar9;
  int iVar10;
  ChannelOrder CVar11;
  ConstPixelBufferAccess *pCVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int x;
  int y_00;
  int iVar16;
  int iVar17;
  MultisamplePixelBufferAccess access;
  Vec4 c;
  MultisamplePixelBufferAccess stencilBuf;
  MultisamplePixelBufferAccess depthBuf;
  MultisamplePixelBufferAccess colorBuf0;
  ConstPixelBufferAccess local_158;
  int local_130;
  int local_12c;
  int local_128;
  int local_124;
  ReferenceContext *local_120;
  ConstPixelBufferAccess local_118;
  MultisamplePixelBufferAccess local_e8;
  MultisamplePixelBufferAccess local_b8;
  MultisamplePixelBufferAccess local_90;
  MultisamplePixelBufferAccess local_68;
  
  if ((buffers & 0xffffbaff) == 0) {
    getDrawColorbuffer(&local_68,this);
    getDrawDepthbuffer(&local_90,this);
    getDrawStencilbuffer(&local_b8,this);
    iVar13 = 0x7fffffff;
    iVar10 = 0x7fffffff;
    iVar17 = 0;
    iVar14 = 0;
    if (this->m_scissorEnabled == true) {
      iVar13 = (this->m_scissorBox).m_data[3];
      iVar10 = (this->m_scissorBox).m_data[2];
      iVar14 = (this->m_scissorBox).m_data[0];
      iVar17 = (this->m_scissorBox).m_data[1];
    }
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              ((MultisampleConstPixelBufferAccess *)&local_158,&local_68);
    x = 0;
    if (0 < iVar14) {
      x = iVar14;
    }
    y = 0;
    if (0 < iVar17) {
      y = iVar17;
    }
    iVar10 = iVar10 + iVar14;
    iVar14 = local_158.m_size.m_data[1];
    if (iVar10 < local_158.m_size.m_data[1]) {
      iVar14 = iVar10;
    }
    iVar13 = iVar13 + iVar17;
    iVar17 = local_158.m_size.m_data[2];
    if (iVar13 < local_158.m_size.m_data[2]) {
      iVar17 = iVar13;
    }
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              ((MultisampleConstPixelBufferAccess *)&local_158,&local_90);
    iVar15 = local_158.m_size.m_data[1];
    if (iVar10 < local_158.m_size.m_data[1]) {
      iVar15 = iVar10;
    }
    iVar16 = local_158.m_size.m_data[2];
    if (iVar13 < local_158.m_size.m_data[2]) {
      iVar16 = iVar13;
    }
    iVar15 = iVar15 - x;
    iVar16 = iVar16 - y;
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              ((MultisampleConstPixelBufferAccess *)&local_158,&local_b8);
    if (local_158.m_size.m_data[1] <= iVar10) {
      iVar10 = local_158.m_size.m_data[1];
    }
    if (local_158.m_size.m_data[2] <= iVar13) {
      iVar13 = local_158.m_size.m_data[2];
    }
    iVar10 = iVar10 - x;
    iVar13 = iVar13 - y;
    local_12c = iVar15;
    if (iVar15 < 1) {
      local_12c = 0;
    }
    local_130 = iVar16;
    if (iVar16 < 1) {
      local_130 = 0;
    }
    local_128 = iVar10;
    if (iVar10 < 1) {
      local_128 = 0;
    }
    local_124 = iVar13;
    if (iVar13 < 1) {
      local_124 = 0;
    }
    if (((0x3fff < buffers) && (0 < iVar14 - x)) && (0 < iVar17 - y)) {
      rr::getSubregion((MultisamplePixelBufferAccess *)&local_158,&local_68,x,y,iVar14 - x,
                       iVar17 - y);
      bVar2 = tcu::isSRGB(local_68.m_access.super_ConstPixelBufferAccess.m_format);
      if ((bVar2) && (this->m_sRGBUpdateEnabled == true)) {
        tcu::linearToSRGB((tcu *)&local_118,&this->m_clearColor);
      }
      else {
        local_118.m_format.order = (ChannelOrder)(this->m_clearColor).m_data[0];
        local_118.m_format.type = (ChannelType)(this->m_clearColor).m_data[1];
        local_118.m_size.m_data._0_8_ = *(undefined8 *)((this->m_clearColor).m_data + 2);
      }
      bVar2 = (this->m_colorMask).m_data[0];
      bVar3 = 1;
      if (((bVar2 == true) && ((this->m_colorMask).m_data[1] == true)) &&
         ((this->m_colorMask).m_data[2] == true)) {
        bVar3 = (this->m_colorMask).m_data[3] ^ 1;
      }
      if (((bVar2 == false) && ((this->m_colorMask).m_data[1] == false)) &&
         ((this->m_colorMask).m_data[2] == false)) {
        bVar6 = (this->m_colorMask).m_data[3] ^ 1;
      }
      else {
        bVar6 = 0;
      }
      if (bVar3 == 0) {
        rr::clear((MultisamplePixelBufferAccess *)&local_158,(Vec4 *)&local_118);
      }
      else if ((bVar6 == 0) && (0 < local_158.m_size.m_data[2])) {
        iVar14 = 0;
        do {
          if (0 < local_158.m_size.m_data[1]) {
            iVar17 = 0;
            do {
              if (0 < local_158.m_size.m_data[0]) {
                y_00 = 0;
                do {
                  tcu::ConstPixelBufferAccess::getPixel
                            ((ConstPixelBufferAccess *)&stack0xffffffffffffffc0,(int)&local_158,y_00
                             ,iVar17);
                  local_e8.m_access.super_ConstPixelBufferAccess.m_format.order = R;
                  local_e8.m_access.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
                  local_e8.m_access.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
                  local_e8.m_access.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
                  pCVar5 = &local_118;
                  lVar9 = 0;
                  pCVar8 = (ConstPixelBufferAccess *)&stack0xffffffffffffffc0;
                  do {
                    pCVar12 = pCVar5;
                    if ((this->m_colorMask).m_data[lVar9] == false) {
                      pCVar12 = pCVar8;
                    }
                    local_e8.m_access.super_ConstPixelBufferAccess.m_size.m_data[lVar9 + -2] =
                         (pCVar12->m_format).order;
                    lVar9 = lVar9 + 1;
                    pCVar8 = (ConstPixelBufferAccess *)&(pCVar8->m_format).type;
                    pCVar5 = (ConstPixelBufferAccess *)&(pCVar5->m_format).type;
                  } while (lVar9 != 4);
                  tcu::PixelBufferAccess::setPixel
                            ((PixelBufferAccess *)&local_158,(Vec4 *)&local_e8,y_00,iVar17,iVar14);
                  y_00 = y_00 + 1;
                } while (y_00 < local_158.m_size.m_data[0]);
              }
              iVar17 = iVar17 + 1;
            } while (iVar17 < local_158.m_size.m_data[1]);
          }
          iVar14 = iVar14 + 1;
        } while (iVar14 < local_158.m_size.m_data[2]);
      }
    }
    if (((buffers >> 8 & 1) != 0 && (0 < iVar16 && 0 < iVar15)) && (this->m_depthMask == true)) {
      rr::getSubregion(&local_e8,&local_90,x,y,local_12c,local_130);
      tcu::getEffectiveDepthStencilAccess
                ((PixelBufferAccess *)&local_158,&local_e8.m_access,MODE_DEPTH);
      rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)&local_158);
      rr::clearDepth((MultisamplePixelBufferAccess *)&local_118,this->m_clearDepth);
    }
    if ((buffers >> 10 & 1) != 0 && (0 < iVar10 && 0 < iVar13)) {
      rr::getSubregion(&local_e8,&local_b8,x,y,local_128,local_124);
      tcu::getEffectiveDepthStencilAccess
                ((PixelBufferAccess *)&local_158,&local_e8.m_access,MODE_STENCIL);
      rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)&local_158);
      if (local_b8.m_access.super_ConstPixelBufferAccess.m_format.order == DS) {
        uVar7 = (uint)(local_b8.m_access.super_ConstPixelBufferAccess.m_format.type ==
                       FLOAT_UNSIGNED_INT_24_8_REV ||
                      local_b8.m_access.super_ConstPixelBufferAccess.m_format.type ==
                      UNSIGNED_INT_24_8) << 3;
      }
      else {
        uVar7 = 0;
        if ((local_b8.m_access.super_ConstPixelBufferAccess.m_format.order == S) &&
           (uVar7 = 0,
           local_b8.m_access.super_ConstPixelBufferAccess.m_format.type - UNSIGNED_INT8 < 4)) {
          uVar7 = *(uint *)(&DAT_00688400 +
                           (ulong)(local_b8.m_access.super_ConstPixelBufferAccess.m_format.type -
                                  UNSIGNED_INT8) * 4);
        }
      }
      uVar4 = -1 << ((byte)uVar7 & 0x1f);
      CVar11 = ~uVar4;
      if (0x1f < uVar7) {
        CVar11 = ~R;
      }
      CVar11 = CVar11 & this->m_clearStencil;
      if ((uVar4 | this->m_stencil[0].writeMask) == 0xffffffff) {
        rr::clearStencil((MultisamplePixelBufferAccess *)&local_118,CVar11);
      }
      else if (0 < local_118.m_size.m_data[2]) {
        iVar13 = 0;
        local_120 = this;
        do {
          if (0 < local_118.m_size.m_data[1]) {
            iVar10 = 0;
            do {
              if (0 < local_118.m_size.m_data[0]) {
                iVar14 = 0;
                do {
                  CVar1 = local_120->m_stencil[0].writeMask;
                  tcu::ConstPixelBufferAccess::getPixelInt(&local_158,(int)&local_118,iVar14,iVar10)
                  ;
                  local_158.m_format.order =
                       (CVar11 ^ local_158.m_format.order) & CVar1 ^ local_158.m_format.order;
                  local_158.m_format.type = SNORM_INT8;
                  local_158.m_size.m_data[0] = 0;
                  local_158.m_size.m_data[1] = 0;
                  tcu::PixelBufferAccess::setPixel
                            ((PixelBufferAccess *)&local_118,(IVec4 *)&local_158,iVar14,iVar10,
                             iVar13);
                  iVar14 = iVar14 + 1;
                } while (iVar14 < local_118.m_size.m_data[0]);
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 < local_118.m_size.m_data[1]);
          }
          iVar13 = iVar13 + 1;
        } while (iVar13 < local_118.m_size.m_data[2]);
      }
    }
  }
  else if (this->m_lastError == 0) {
    this->m_lastError = 0x501;
  }
  return;
}

Assistant:

void ReferenceContext::clear (deUint32 buffers)
{
	RC_IF_ERROR((buffers & ~(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT)) != 0, GL_INVALID_VALUE, RC_RET_VOID);

	rr::MultisamplePixelBufferAccess	colorBuf0	= getDrawColorbuffer();
	rr::MultisamplePixelBufferAccess	depthBuf	= getDrawDepthbuffer();
	rr::MultisamplePixelBufferAccess	stencilBuf	= getDrawStencilbuffer();
	IVec4								baseArea	= m_scissorEnabled ? m_scissorBox : IVec4(0, 0, 0x7fffffff, 0x7fffffff);
	IVec4								colorArea	= intersect(baseArea, getBufferRect(colorBuf0));
	IVec4								depthArea	= intersect(baseArea, getBufferRect(depthBuf));
	IVec4								stencilArea	= intersect(baseArea, getBufferRect(stencilBuf));
	bool								hasColor0	= !isEmpty(colorArea);
	bool								hasDepth	= !isEmpty(depthArea);
	bool								hasStencil	= !isEmpty(stencilArea);

	if (hasColor0 && (buffers & GL_COLOR_BUFFER_BIT) != 0)
	{
		rr::MultisamplePixelBufferAccess	access		= rr::getSubregion(colorBuf0, colorArea.x(), colorArea.y(), colorArea.z(), colorArea.w());
		bool								isSRGB		= tcu::isSRGB(colorBuf0.raw().getFormat());
		Vec4								c			= (isSRGB && m_sRGBUpdateEnabled) ? tcu::linearToSRGB(m_clearColor) : m_clearColor;
		bool								maskUsed	= !m_colorMask[0] || !m_colorMask[1] || !m_colorMask[2] || !m_colorMask[3];
		bool								maskZero	= !m_colorMask[0] && !m_colorMask[1] && !m_colorMask[2] && !m_colorMask[3];

		if (!maskUsed)
			rr::clear(access, c);
		else if (!maskZero)
		{
			for (int y = 0; y < access.raw().getDepth(); y++)
				for (int x = 0; x < access.raw().getHeight(); x++)
					for (int s = 0; s < access.getNumSamples(); s++)
						access.raw().setPixel(tcu::select(c, access.raw().getPixel(s, x, y), m_colorMask), s, x, y);
		}
		// else all channels masked out
	}

	if (hasDepth && (buffers & GL_DEPTH_BUFFER_BIT) != 0 && m_depthMask)
	{
		rr::MultisamplePixelBufferAccess access = getDepthMultisampleAccess(rr::getSubregion(depthBuf, depthArea.x(), depthArea.y(), depthArea.z(), depthArea.w()));
		rr::clearDepth(access, m_clearDepth);
	}

	if (hasStencil && (buffers & GL_STENCIL_BUFFER_BIT) != 0)
	{
		rr::MultisamplePixelBufferAccess	access					= getStencilMultisampleAccess(rr::getSubregion(stencilBuf, stencilArea.x(), stencilArea.y(), stencilArea.z(), stencilArea.w()));
		int									stencilBits				= getNumStencilBits(stencilBuf.raw().getFormat());
		int									stencil					= maskStencil(stencilBits, m_clearStencil);

		if ((m_stencil[rr::FACETYPE_FRONT].writeMask & ((1u<<stencilBits)-1u)) != ((1u<<stencilBits)-1u))
		{
			// Slow path where depth or stencil is masked out in write.
			for (int y = 0; y < access.raw().getDepth(); y++)
				for (int x = 0; x < access.raw().getHeight(); x++)
					for (int s = 0; s < access.getNumSamples(); s++)
						writeMaskedStencil(access, s, x, y, stencil, m_stencil[rr::FACETYPE_FRONT].writeMask);
		}
		else
			rr::clearStencil(access, stencil);
	}
}